

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O3

uint __thiscall glsl_type::cl_alignment(glsl_type *this)

{
  glsl_type *pgVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  glsl_type *t;
  long lVar5;
  ulong uVar6;
  
  uVar2 = *(uint *)&this->field_0x4;
  bVar4 = this->vector_elements;
  while ((bVar4 != 1 || 0xd < (uVar2 & 0xfe) &&
         ((0xb < (uVar2 & 0xfc) || bVar4 < 2) || this->matrix_columns != '\x01'))) {
    if ((char)uVar2 != '\x11') {
      uVar3 = 1;
      if ((((uVar2 & 0xff) == 0xf) && ((uVar2 >> 0x19 & 1) == 0)) && (this->length != 0)) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          pgVar1 = (this->fields).array;
          uVar2 = cl_alignment(*(glsl_type **)((long)&pgVar1->gl_type + lVar5));
          if (uVar3 <= uVar2) {
            uVar3 = cl_alignment(*(glsl_type **)((long)&pgVar1->gl_type + lVar5));
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x30;
        } while (uVar6 < this->length);
      }
      return uVar3;
    }
    do {
      this = (this->fields).array;
      uVar2 = *(uint *)&this->field_0x4;
    } while ((char)uVar2 == '\x11');
    bVar4 = this->vector_elements;
  }
  uVar2 = cl_size(this);
  return uVar2;
}

Assistant:

unsigned
glsl_type::cl_alignment() const
{
   /* vectors unlike arrays are aligned to their size */
   if (this->is_scalar() || this->is_vector())
      return this->cl_size();
   else if (this->is_array())
      return this->without_array()->cl_alignment();
   else if (this->is_struct()) {
      /* Packed Structs are 0x1 aligned despite their size. */
      if (this->packed)
         return 1;

      unsigned res = 1;
      for (unsigned i = 0; i < this->length; ++i) {
         struct glsl_struct_field &field = this->fields.structure[i];
         res = MAX2(res, field.type->cl_alignment());
      }
      return res;
   }
   return 1;
}